

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

int identify_pack(int id_limit)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  obj *poVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  obj *otmp;
  ulong uVar8;
  int iVar9;
  object_pick *pick_list;
  char buf [256];
  object_pick *local_140;
  char local_138 [264];
  
  uVar7 = (ulong)(uint)id_limit;
  if (invent == (obj *)0x0) {
    poVar4 = (obj *)0x0;
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    poVar4 = (obj *)0x0;
    otmp = invent;
    do {
      bVar1 = not_fully_identified(otmp);
      if (bVar1 != '\0') {
        poVar4 = otmp;
      }
      iVar9 = iVar9 + (uint)(bVar1 != '\0');
      otmp = otmp->nobj;
    } while (otmp != (obj *)0x0);
  }
  if (iVar9 == 0) {
    iVar9 = 0;
    pline("You have already identified all of your possessions.");
  }
  else if (id_limit == 0) {
    if (iVar9 == 1) {
      fully_identify_obj(poVar4);
      prinv((char *)0x0,poVar4,0);
      iVar9 = 1;
    }
    else {
      iVar9 = 0;
      for (poVar4 = invent; poVar4 != (obj *)0x0; poVar4 = poVar4->nobj) {
        bVar1 = not_fully_identified(poVar4);
        if (bVar1 != '\0') {
          fully_identify_obj(poVar4);
          prinv((char *)0x0,poVar4,0);
          iVar9 = iVar9 + 1;
        }
      }
    }
  }
  else {
    pcVar3 = "first";
    iVar9 = 0;
    do {
      sprintf(local_138,"What would you like to identify %s?",pcVar3);
      uVar2 = query_objlist(local_138,invent,0x1c,&local_140,2,not_fully_identified);
      iVar6 = (int)uVar7;
      if ((int)uVar2 < 1) {
        if (-1 < (int)uVar2) goto LAB_001b01de;
        uVar7 = 0;
        pline("That was all.");
      }
      else {
        uVar8 = (ulong)uVar2;
        if (iVar6 <= (int)uVar2) {
          uVar8 = uVar7;
        }
        if (0 < iVar6) {
          lVar5 = 0;
          do {
            poVar4 = *(obj **)((long)&local_140->obj + lVar5);
            fully_identify_obj(poVar4);
            prinv((char *)0x0,poVar4,0);
            lVar5 = lVar5 + 0x10;
          } while (uVar8 << 4 != lVar5);
          iVar9 = iVar9 + (int)uVar8;
          uVar7 = (ulong)(uint)(iVar6 - (int)uVar8);
        }
        free(local_140);
        if ((int)uVar7 == 0) {
LAB_001b01de:
          uVar7 = 0;
        }
        else {
          (*windowprocs.win_pause)(P_MESSAGE);
        }
      }
      pcVar3 = "next";
    } while ((int)uVar7 != 0);
  }
  update_inventory();
  return iVar9;
}

Assistant:

int identify_pack(int id_limit)
{
    struct obj *obj, *the_obj;
    int unid_cnt;
    int num_identified = 0;

    unid_cnt = 0;
    the_obj = 0;		/* if unid_cnt ends up 1, this will be it */
    for (obj = invent; obj; obj = obj->nobj)
	if (not_fully_identified(obj)) ++unid_cnt, the_obj = obj;

    if (!unid_cnt) {
	pline("You have already identified all of your possessions.");
    } else if (!id_limit) {
	/* identify everything */
	if (unid_cnt == 1) {
	    identify(the_obj);
	    num_identified = 1;
	} else {
	    /* TODO:  use fully_identify_obj and cornline/menu/whatever here */
	    for (obj = invent; obj; obj = obj->nobj) {
		if (not_fully_identified(obj)) {
		    identify(obj);
		    num_identified++;
		}
	    }
	}
    } else {
	/* identify up to `id_limit' items */
	num_identified = menu_identify(id_limit);
    }
    update_inventory();

    return num_identified;
}